

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_int8_array(coda_cursor *cursor,int8_t *dst,coda_array_ordering array_ordering)

{
  coda_type_class cVar1;
  int iVar2;
  coda_type *pcVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *message;
  coda_native_type native_type;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar3 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar3 == (coda_type *)0x0)) {
    pcVar5 = "invalid cursor argument (%s:%u)";
    uVar6 = 0xb5c;
  }
  else {
    if (dst != (int8_t *)0x0) {
      if (99 < pcVar3->format) {
        pcVar3 = *(coda_type **)&pcVar3->type_class;
      }
      if (pcVar3->type_class == coda_array_class) {
        pcVar3 = *(coda_type **)(pcVar3 + 1);
        cVar1 = pcVar3->type_class;
        piVar4 = (int *)__tls_get_addr(&PTR_001e0ea8);
        if (((cVar1 != coda_integer_class) && (cVar1 != coda_real_class)) ||
           ((*piVar4 == 0 || (native_type = coda_native_type_double, pcVar3[1].name == (char *)0x0))
           )) {
          native_type = pcVar3->read_type;
        }
        if (native_type == coda_native_type_int8) {
          iVar2 = read_int8_array(cursor,dst,array_ordering);
          return -(uint)(iVar2 != 0);
        }
        pcVar5 = coda_type_get_native_type_name(native_type);
        message = "can not read %s data using a int8 data type";
      }
      else {
        pcVar5 = coda_type_get_class_name(pcVar3->type_class);
        message = "cursor does not refer to an array (current type is %s)";
      }
      coda_set_error(-0x69,message,pcVar5);
      return -1;
    }
    pcVar5 = "dst argument is NULL (%s:%u)";
    uVar6 = 0xb61;
  }
  coda_set_error(-100,pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar6);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_int8_array(const coda_cursor *cursor, int8_t *dst, coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int8 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}